

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_map.c
# Opt level: O1

int map_clear(map m)

{
  void *__ptr;
  size_t size;
  bucket pbVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  iVar2 = 1;
  if (m != (map)0x0) {
    if (m->buckets != (bucket)0x0) {
      if (m->capacity != 0) {
        lVar3 = 0x10;
        uVar4 = 0;
        do {
          __ptr = *(void **)((long)&m->buckets->count + lVar3);
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          uVar4 = uVar4 + 1;
          lVar3 = lVar3 + 0x18;
        } while (uVar4 < m->capacity);
      }
      free(m->buckets);
    }
    iVar2 = 0;
    m->count = 0;
    m->prime = 0;
    size = bucket_capacity(0);
    m->capacity = size;
    pbVar1 = bucket_create(size);
    m->buckets = pbVar1;
    if (pbVar1 == (bucket)0x0) {
      log_write_impl_va("metacall",0x1d1,"map_clear",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_map.c"
                        ,3,"Bad map clear bucket creation");
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int map_clear(map m)
{
	if (m == NULL)
	{
		return 1;
	}

	if (m->buckets != NULL)
	{
		size_t iterator;

		for (iterator = 0; iterator < m->capacity; ++iterator)
		{
			bucket b = &m->buckets[iterator];

			if (b->pairs != NULL)
			{
				free(b->pairs);
			}
		}

		free(m->buckets);
	}

	m->count = 0;
	m->prime = 0;
	m->capacity = bucket_capacity(m->prime);
	m->buckets = bucket_create(m->capacity);

	if (m->buckets == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad map clear bucket creation");
		return 1;
	}

	return 0;
}